

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LineRenderCase::
genTessellationControlSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  ostringstream buf;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\nlayout(vertices=2) out;\nin highp vec4 vtx_color[];\nout highp vec4 tess_ctrl_color[];\nuniform highp float u_tessellationLevel;\nuniform highp vec4 u_posScale;\nuniform highp float u_lineWidth;\n"
             ,0x114);
  if (*(char *)((long)this + 0x83) == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n",
               0x4e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "patch out highp float vp_bbox_expansionSize;\npatch out highp vec3 vp_bbox_clipMin;\npatch out highp vec3 vp_bbox_clipMax;\n"
             ,0x79);
  if (*(char *)((long)this + 0x83) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    if (*(char *)((long)this + 0x81) == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
                 ,0xf1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "vec4 mirrorY(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(p.x, 2.0 * patternCenter.y - p.y, p.z, p.w);\n}\n"
               ,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"vec4 transformVec(in highp vec4 p)\n{\n\treturn ",0x2d);
    pcVar2 = "mirrorY(p)";
    if ((ulong)*(byte *)((long)this + 0x81) != 0) {
      pcVar2 = "mirrorX(mirrorY(p))";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,pcVar2,(ulong)*(byte *)((long)this + 0x81) * 9 + 10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,";\n}\n",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\nvoid main()\n{\n\t// convert to nonsensical coordinates, just in case\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n\ttess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n\n\tgl_TessLevelOuter[0] = 0.8; // will be rounded up to 1\n\tgl_TessLevelOuter[1] = u_tessellationLevel;\n"
             ,0x13a);
  pcVar2 = 
  "\n\thighp vec4 bboxMin = u_primitiveBBoxMin;\n\thighp vec4 bboxMax = u_primitiveBBoxMax;\n";
  bVar3 = *(char *)((long)this + 0x83) != '\0';
  if (bVar3) {
    pcVar2 = 
    "\n\thighp vec4 bboxMin = min(transformVec(gl_in[0].gl_Position),\n\t                         transformVec(gl_in[1].gl_Position));\n\thighp vec4 bboxMax = max(transformVec(gl_in[0].gl_Position),\n\t                         transformVec(gl_in[1].gl_Position));\n"
    ;
  }
  lVar1 = 0x55;
  if (bVar3) {
    lVar1 = 0xfb;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
  if (*(char *)((long)this + 0x82) == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "\n\t${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n\t${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n"
               ,0x4f);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\tvp_bbox_expansionSize = u_lineWidth;\n\tvp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n\t                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n\tvp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n\t                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n}\n"
             ,0x152);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string LineRenderCase::genTessellationControlSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			"${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n"
			"layout(vertices=2) out;"
			"\n"
			"in highp vec4 vtx_color[];\n"
			"out highp vec4 tess_ctrl_color[];\n"
			"uniform highp float u_tessellationLevel;\n"
			"uniform highp vec4 u_posScale;\n"
			"uniform highp float u_lineWidth;\n";

	if (!m_calcPerPrimitiveBBox)
	{
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n";
	}

	buf <<	"patch out highp float vp_bbox_expansionSize;\n"
			"patch out highp vec3 vp_bbox_clipMin;\n"
			"patch out highp vec3 vp_bbox_clipMax;\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n";
		if (m_hasGeometryStage)
			buf << genShaderFunction(SHADER_FUNC_MIRROR_X);
		buf << genShaderFunction(SHADER_FUNC_MIRROR_Y);

		buf <<	"vec4 transformVec(in highp vec4 p)\n"
				"{\n"
				"	return " << ((m_hasGeometryStage) ? ("mirrorX(mirrorY(p))") : ("mirrorY(p)")) << ";\n"
				"}\n";
	}

	buf <<	"\n"
			"void main()\n"
			"{\n"
			"	// convert to nonsensical coordinates, just in case\n"
			"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n"
			"	tess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n"
			"\n"
			"	gl_TessLevelOuter[0] = 0.8; // will be rounded up to 1\n"
			"	gl_TessLevelOuter[1] = u_tessellationLevel;\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n"
				"	highp vec4 bboxMin = min(transformVec(gl_in[0].gl_Position),\n"
				"	                         transformVec(gl_in[1].gl_Position));\n"
				"	highp vec4 bboxMax = max(transformVec(gl_in[0].gl_Position),\n"
				"	                         transformVec(gl_in[1].gl_Position));\n";
	}
	else
	{
		buf <<	"\n"
				"	highp vec4 bboxMin = u_primitiveBBoxMin;\n"
				"	highp vec4 bboxMax = u_primitiveBBoxMax;\n";
	}

	if (!m_useGlobalState)
		buf <<	"\n"
				"	${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n"
				"	${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n";

	buf <<	"	vp_bbox_expansionSize = u_lineWidth;\n"
			"	vp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n"
			"	                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n"
			"	vp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n"
			"	                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n"
			"}\n";

	return buf.str();
}